

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O2

void proxy_worker_func(worker_handle *wh)

{
  mutex_handle *mutex;
  long *data;
  mutex_handle *pmVar1;
  long *plVar2;
  long lVar3;
  proxy_handle *ppVar4;
  proxy_conn_handle *ppVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  size_t data_len;
  proxy_conn_handle ***ppppVar9;
  char *pcVar10;
  size_t buff_len;
  undefined1 *buff_00;
  proxy_conn_handle **pppVar11;
  proxy_conn_handle *pc;
  uint8_t *buff_01;
  uint32_t nonce;
  mutex_handle *local_b8;
  proxy_conn_handle **local_b0;
  uint8_t local_a8 [23];
  char nonce_str [9];
  uint8_t buff [28];
  char remote_addr [54];
  
  plVar2 = (long *)wh->func_ctx;
  lVar3 = *(long *)*plVar2;
  mutex = (mutex_handle *)(plVar2 + 3);
  mutex_lock_shared(mutex);
  if (plVar2[1] == 0) {
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_ERROR,
              "New connection was signaled, but no connection was given\n");
    mutex_unlock_shared(mutex);
    return;
  }
  mutex_unlock_shared(mutex);
  conn_get_remote_addr((conn_handle *)plVar2[1],remote_addr);
  proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_DEBUG,
            "New connection - beginning authorization procedure\n");
  iVar7 = rand_get(&nonce);
  if (-1 < iVar7) {
    digest_to_hex32(nonce,nonce_str);
    get_password_response(nonce,*(char **)(*plVar2 + 0x30),local_a8);
    iVar7 = conn_send((conn_handle *)plVar2[1],(uint8_t *)nonce_str,8);
    if (-1 < iVar7) {
      buff_01 = buff;
      iVar7 = conn_recv((conn_handle *)plVar2[1],buff_01,0x10);
      if (-1 < iVar7) {
        iVar7 = -0x16;
        for (buff_len = 1; buff_len != 0xc; buff_len = buff_len + 1) {
          if (*buff_01 == '\n') {
            *buff_01 = '\0';
            data = plVar2 + 8;
            strcpy((char *)data,(char *)buff);
            iVar7 = conn_recv((conn_handle *)plVar2[1],buff + 0x10,buff_len);
            if (iVar7 < 0) goto LAB_00104e57;
            lVar8 = 0;
            buff_00 = proxy_worker_authorize_msg_bad_pw;
            pcVar10 = "Client \'%s\' supplied an incorrect password. Dropping...\n";
            goto LAB_00104ef5;
          }
          buff_01 = buff_01 + 1;
        }
        goto LAB_00104ffa;
      }
    }
  }
LAB_00104e57:
  if ((((iVar7 == -0x6b) || (iVar7 == -0x68)) || (iVar7 == -4)) || (iVar7 == -0x20)) {
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_WARN,
              "Connection to client was lost before authorization could complete\n");
    goto LAB_00105026;
  }
  goto LAB_00104ffa;
LAB_00104ef5:
  if (lVar8 == 0x10) goto LAB_00104f0f;
  if (local_a8[lVar8] != buff_01[lVar8 + 1]) goto LAB_00104fcb;
  lVar8 = lVar8 + 1;
  goto LAB_00104ef5;
LAB_00104f0f:
  iVar7 = proxy_authorize_callsign((proxy_handle *)*plVar2,(char *)data);
  if (iVar7 != 0) {
    proxy_update_registration((proxy_handle *)*plVar2);
    data_len = strlen((char *)data);
    bVar6 = pearson_get((uint8_t *)data,data_len);
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_DEBUG,"Searching callsign bucket %u\n");
    pmVar1 = (mutex_handle *)(lVar3 + 0x878);
    mutex_lock(pmVar1);
    if (*(long *)(lVar3 + 8) == 0) {
      mutex_unlock(pmVar1);
      proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_ERROR,"Idle slot pool is empty.\n");
    }
    else {
      pppVar11 = (proxy_conn_handle **)(lVar3 + (ulong)bVar6 * 8 + 0x18);
      local_b8 = pmVar1;
      local_b0 = pppVar11;
      while (pc = *pppVar11, pc != (proxy_conn_handle *)0x0) {
        iVar7 = proxy_conn_accept(pc,(conn_handle *)plVar2[1],(char *)data,'\x01');
        if (iVar7 != -0x10) goto LAB_001050d4;
        pppVar11 = &pc->next_by_call;
      }
      pc = *(proxy_conn_handle **)(lVar3 + 8);
      iVar7 = proxy_conn_accept(pc,(conn_handle *)plVar2[1],(char *)data,'\0');
LAB_001050d4:
      pmVar1 = local_b8;
      if (iVar7 < 0) {
        mutex_unlock(local_b8);
        ppVar4 = (proxy_handle *)*plVar2;
        pcVar10 = strerror(-iVar7);
        proxy_log(ppVar4,LOG_LEVEL_ERROR,"Failed to acquire slot (%d): %s\n",(ulong)(uint)-iVar7,
                  pcVar10);
      }
      else {
        ppVar5 = pc->next;
        *pc->prev_ptr = ppVar5;
        ppppVar9 = &ppVar5->prev_ptr;
        if (ppVar5 == (proxy_conn_handle *)0x0) {
          ppppVar9 = (proxy_conn_handle ***)(lVar3 + 0x10);
        }
        *ppppVar9 = pc->prev_ptr;
        if (pc->prev_by_call_ptr != (proxy_conn_handle **)0x0) {
          ppVar5 = pc->next_by_call;
          *pc->prev_by_call_ptr = ppVar5;
          if (ppVar5 != (proxy_conn_handle *)0x0) {
            ppVar5->prev_by_call_ptr = pc->prev_by_call_ptr;
          }
        }
        pc->prev_by_call_ptr = local_b0;
        ppVar5 = *local_b0;
        pc->next_by_call = ppVar5;
        if (ppVar5 != (proxy_conn_handle *)0x0) {
          ppVar5->prev_by_call_ptr = &pc->next_by_call;
        }
        *local_b0 = pc;
        mutex_unlock(local_b8);
        do {
          iVar7 = proxy_conn_process(pc);
        } while (-1 < iVar7);
        proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_INFO,"Disconnected from client \'%s\'.\n",data);
        proxy_conn_finish(pc);
        pc->next = (proxy_conn_handle *)0x0;
        mutex_lock(pmVar1);
        pppVar11 = *(proxy_conn_handle ***)(lVar3 + 0x10);
        pc->prev_ptr = pppVar11;
        *pppVar11 = pc;
        *(proxy_conn_handle ***)(lVar3 + 0x10) = &pc->next;
        mutex_unlock(pmVar1);
      }
    }
    mutex_lock(mutex);
    conn_free((conn_handle *)plVar2[1]);
    free((void *)plVar2[1]);
    plVar2[1] = 0;
    mutex_unlock(mutex);
    mutex_lock((mutex_handle *)(lVar3 + 0x880));
    plVar2[2] = *(long *)(lVar3 + 0x820);
    *(long **)(lVar3 + 0x820) = plVar2;
    mutex_unlock((mutex_handle *)(lVar3 + 0x880));
    proxy_update_registration((proxy_handle *)*plVar2);
    proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_DEBUG,"Client worker is returning cleanly.\n");
    return;
  }
  buff_00 = proxy_worker_authorize_msg_bad_auth;
  pcVar10 = "Client \'%s\' is not authorized to use this proxy. Dropping...\n";
LAB_00104fcb:
  proxy_log((proxy_handle *)*plVar2,LOG_LEVEL_INFO,pcVar10,data);
  iVar7 = conn_send((conn_handle *)plVar2[1],buff_00,10);
  if (iVar7 < 0) goto LAB_00104e57;
  iVar7 = -0xd;
LAB_00104ffa:
  ppVar4 = (proxy_handle *)*plVar2;
  pcVar10 = strerror(-iVar7);
  proxy_log(ppVar4,LOG_LEVEL_ERROR,"Authorization failed for client \'%s\' (%d): %s\n",remote_addr,
            (ulong)(uint)-iVar7,pcVar10);
LAB_00105026:
  mutex_lock(mutex);
  conn_free((conn_handle *)plVar2[1]);
  free((void *)plVar2[1]);
  plVar2[1] = 0;
  mutex_unlock(mutex);
  mutex_lock((mutex_handle *)(lVar3 + 0x880));
  plVar2[2] = *(long *)(lVar3 + 0x820);
  *(long **)(lVar3 + 0x820) = plVar2;
  mutex_unlock((mutex_handle *)(lVar3 + 0x880));
  return;
}

Assistant:

static void proxy_worker_func(struct worker_handle *wh)
{
	struct proxy_worker *pw = wh->func_ctx;
	struct proxy_priv *priv = pw->ph->priv;
	struct proxy_conn_handle *pc = NULL;
	int ret;
	char remote_addr[54];
	uint8_t hash;

	mutex_lock_shared(&pw->mutex);

	if (pw->conn_client == NULL) {
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "New connection was signaled, but no connection was given\n");

		mutex_unlock_shared(&pw->mutex);

		return;
	}

	mutex_unlock_shared(&pw->mutex);

	conn_get_remote_addr(pw->conn_client, remote_addr);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "New connection - beginning authorization procedure\n");

	ret = proxy_worker_authorize(pw);
	if (ret < 0) {
		switch (ret) {
		case -ECONNRESET:
		case -EINTR:
		case -ENOTCONN:
		case -EPIPE:
			proxy_log(pw->ph, LOG_LEVEL_WARN,
				  "Connection to client was lost before authorization could complete\n");
			break;
		default:
			proxy_log(pw->ph, LOG_LEVEL_ERROR,
				  "Authorization failed for client '%s' (%d): %s\n",
				  remote_addr, -ret, strerror(-ret));
		}

		mutex_lock(&pw->mutex);
		conn_free(pw->conn_client);
		free(pw->conn_client);
		pw->conn_client = NULL;
		mutex_unlock(&pw->mutex);

		mutex_lock(&priv->idle_workers_mutex);
		pw->next = priv->idle_workers_head;
		priv->idle_workers_head = pw;
		mutex_unlock(&priv->idle_workers_mutex);

		return;
	}

	proxy_update_registration(pw->ph);

	hash = pearson_get((uint8_t *)pw->callsign, strlen(pw->callsign));
	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Searching callsign bucket %u\n", hash);

	mutex_lock(&priv->idle_clients_mutex);
	if (priv->idle_clients_head == NULL) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Idle slot pool is empty.\n");
		goto proxy_worker_func_exit;
	}

	pc = priv->clients_by_call[hash];
	/* First, check for a reconnect */
	while (pc != NULL) {
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 1);
		if (ret != -EBUSY)
			break;
		pc = pc->next_by_call;
	}
	/* Fall back on the oldest available slot */
	if (pc == NULL) {
		pc = priv->idle_clients_head;
		ret = proxy_conn_accept(pc, pw->conn_client, pw->callsign, 0);
	}
	if (ret < 0) {
		mutex_unlock(&priv->idle_clients_mutex);
		proxy_log(pw->ph, LOG_LEVEL_ERROR,
			  "Failed to acquire slot (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxy_worker_func_exit;
	}

	/* Remove the slot from the pool */
	*pc->prev_ptr = pc->next;
	if (pc->next == NULL)
		priv->idle_clients_tail_ptr = pc->prev_ptr;
	else
		pc->next->prev_ptr = pc->prev_ptr;

	/* Remove the slot from the hash map */
	if (pc->prev_by_call_ptr != NULL) {
		*pc->prev_by_call_ptr = pc->next_by_call;
		if (pc->next_by_call)
			pc->next_by_call->prev_by_call_ptr = pc->prev_by_call_ptr;
	}

	/* Add the slot to the hash map */
	pc->prev_by_call_ptr = &priv->clients_by_call[hash];
	pc->next_by_call = priv->clients_by_call[hash];
	if (pc->next_by_call != NULL)
		pc->next_by_call->prev_by_call_ptr = &pc->next_by_call;
	priv->clients_by_call[hash] = pc;
	mutex_unlock(&priv->idle_clients_mutex);

	do {
		ret = proxy_conn_process(pc);
	} while (ret >= 0);

	proxy_log(pw->ph, LOG_LEVEL_INFO,
		  "Disconnected from client '%s'.\n", pw->callsign);

	proxy_conn_finish(pc);

	/* Put the slot back in the pool */
	pc->next = NULL;
	mutex_lock(&priv->idle_clients_mutex);
	pc->prev_ptr = priv->idle_clients_tail_ptr;
	*priv->idle_clients_tail_ptr = pc;
	priv->idle_clients_tail_ptr = &pc->next;
	mutex_unlock(&priv->idle_clients_mutex);

proxy_worker_func_exit:
	mutex_lock(&pw->mutex);
	conn_free(pw->conn_client);
	free(pw->conn_client);
	pw->conn_client = NULL;
	mutex_unlock(&pw->mutex);

	mutex_lock(&priv->idle_workers_mutex);
	pw->next = priv->idle_workers_head;
	priv->idle_workers_head = pw;
	mutex_unlock(&priv->idle_workers_mutex);

	proxy_update_registration(pw->ph);

	proxy_log(pw->ph, LOG_LEVEL_DEBUG,
		  "Client worker is returning cleanly.\n");
}